

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O1

int main(void)

{
  size_type *psVar1;
  ostream *poVar2;
  undefined8 uVar3;
  undefined1 local_2c0 [8];
  P searchRectMax;
  long local_288;
  undefined1 local_280 [16];
  undefined4 local_270 [2];
  P p1;
  P p4;
  P p5;
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  undefined1 *local_168;
  long local_160;
  undefined1 local_158 [16];
  undefined1 *local_148;
  long local_140;
  undefined1 local_138 [16];
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> tree;
  P p2;
  vector<P_*,_std::allocator<P_*>_> result;
  P searchRectMin;
  P p3;
  vector<P_*,_std::allocator<P_*>_> values;
  
  searchRectMax.d2.field_2._8_8_ = local_280;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&searchRectMax.d2.field_2 + 8),"a","");
  local_270[0] = 0;
  p1.d0 = 0;
  p1._4_4_ = 0x40000000;
  p1.d1 = (double)&p1.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&p1.d1,searchRectMax.d2.field_2._8_8_,
             local_288 + searchRectMax.d2.field_2._8_8_);
  if ((undefined1 *)searchRectMax.d2.field_2._8_8_ != local_280) {
    operator_delete((void *)searchRectMax.d2.field_2._8_8_);
  }
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"b","");
  tree.boundingBoxMax._0_4_ = 1;
  p2.d0 = 0;
  p2._4_4_ = 0x40000000;
  p2.d1 = (double)&p2.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&p2.d1,local_1c8,local_1c8 + local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"c","");
  searchRectMin.d2.field_2._8_4_ = 1;
  p3.d0 = 0;
  p3._4_4_ = 0x40000000;
  p3.d1 = (double)&p3.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&p3.d1,local_1a8,local_1a8 + local_1a0);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  local_188 = local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,anon_var_dwarf_3b7d + 0x28,anon_var_dwarf_3b7d + 0x29);
  p1.d2.field_2._8_4_ = 1;
  p4.d0 = 0;
  p4._4_4_ = 0x401c0000;
  p4.d1 = (double)&p4.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&p4.d1,local_188,local_188 + local_180);
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"e","");
  p4.d2.field_2._8_4_ = 1;
  p5.d0 = 0;
  p5._4_4_ = 0x40000000;
  p5.d1 = (double)&p5.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&p5.d1,local_168,local_168 + local_160);
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  p3.d2.field_2._8_8_ = 0;
  result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_270;
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)(p3.d2.field_2._M_local_buf + 8),(iterator)0x0,
             (P **)&result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &tree.boundingBoxMax;
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)(p3.d2.field_2._M_local_buf + 8),(iterator)0x0,
             (P **)&result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)((long)&searchRectMin.d2.field_2 + 8);
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)(p3.d2.field_2._M_local_buf + 8),(iterator)0x0,
             (P **)&result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)((long)&p1.d2.field_2 + 8);
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)(p3.d2.field_2._M_local_buf + 8),(iterator)0x0,
             (P **)&result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)((long)&p4.d2.field_2 + 8);
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)(p3.d2.field_2._M_local_buf + 8),(iterator)0x0,
             (P **)&result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::vector<P_*,_std::allocator<P_*>_>::vector
            ((vector<P_*,_std::allocator<P_*>_> *)((long)&p5.d2.field_2 + 8),
             (vector<P_*,_std::allocator<P_*>_> *)((long)&p3.d2.field_2 + 8));
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::KDTree
            ((KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_108,
             (vector<P_*,_std::allocator<P_*>_> *)((long)&p5.d2.field_2 + 8));
  if (p5.d2.field_2._8_8_ != 0) {
    operator_delete((void *)p5.d2.field_2._8_8_);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"b","");
  result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((ulong)result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  searchRectMin.d0 = 0;
  searchRectMin._4_4_ = 0;
  searchRectMin.d1 = (double)&searchRectMin.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&searchRectMin.d1,local_148,local_148 + local_140);
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,anon_var_dwarf_3b7d + 0x28,anon_var_dwarf_3b7d + 0x29);
  local_2c0._0_4_ = 2;
  searchRectMax.d0 = 0;
  searchRectMax._4_4_ = 0x40180000;
  psVar1 = &searchRectMax.d2._M_string_length;
  searchRectMax.d1 = (double)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&searchRectMax.d1,local_128,local_128 + local_120);
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::queryRectangle
            ((vector<P_*,_std::allocator<P_*>_> *)((long)&p2.d2.field_2 + 8),
             (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_108,
             (P *)&result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(P *)local_2c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"found ",6);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," entries:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar3 = p2.d2.field_2._8_8_;
  if ((pointer)p2.d2.field_2._8_8_ !=
      result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data._M_start)
  {
    do {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(*(P **)uVar3)->d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>((*(P **)uVar3)->d1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,((*(P **)uVar3)->d2)._M_dataplus._M_p,
                          ((*(P **)uVar3)->d2)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar3 = uVar3 + 8;
    } while ((pointer)uVar3 !=
             result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
             _M_start);
  }
  if (p2.d2.field_2._8_8_ != 0) {
    operator_delete((void *)p2.d2.field_2._8_8_);
  }
  if ((size_type *)searchRectMax.d1 != psVar1) {
    operator_delete((void *)searchRectMax.d1);
  }
  if ((size_type *)searchRectMin.d1 != &searchRectMin.d2._M_string_length) {
    operator_delete((void *)searchRectMin.d1);
  }
  P_delete::operator()
            ((P_delete *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(P *)tree.root);
  P_delete::operator()
            ((P_delete *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,tree.boundingBoxMin);
  if (p3.d2.field_2._8_8_ != 0) {
    operator_delete((void *)p3.d2.field_2._8_8_);
  }
  if ((size_type *)p5.d1 != &p5.d2._M_string_length) {
    operator_delete((void *)p5.d1);
  }
  if ((size_type *)p4.d1 != &p4.d2._M_string_length) {
    operator_delete((void *)p4.d1);
  }
  if ((size_type *)p3.d1 != &p3.d2._M_string_length) {
    operator_delete((void *)p3.d1);
  }
  if ((size_type *)p2.d1 != &p2.d2._M_string_length) {
    operator_delete((void *)p2.d1);
  }
  if ((size_type *)p1.d1 != &p1.d2._M_string_length) {
    operator_delete((void *)p1.d1);
  }
  return 1;
}

Assistant:

int main() {
	// prepare elements, three dimensional P objects
	P p1(0, 2, "a");
	P p2(1, 2, "b");
	P p3(1, 2, "c");
	P p4(1, 7, "d");
	P p5(1, 2, "e");

	// prepare the entries
	std::vector<P*> values;
	values.push_back(&p1);
	values.push_back(&p2);
	values.push_back(&p3);
	values.push_back(&p4);
	values.push_back(&p5);

	// the tree uses default implementations of new, delete, set and less for arrays.
	// since we don't use arrays, but the custom type P, we need to pass the functors we defined above to enable the tree to work with P
	kdtree::KDTree<P, dim, P_new, P_delete, P_set, P_less> tree(values);

	// prepare search query.
	// we search for P objects that match these criterias:
	//	d0 >= 0, d0 <= 2
	//	d1 >= 0, d1 <= 6
	//	d2 >= "b", d2 <= "d"
	P searchRectMin(0, 0, "b");
	P searchRectMax(2, 6, "d");

	// perform the search. result will contain the elements that match the query.
	std::vector<P*> result = tree.queryRectangle(&searchRectMin, &searchRectMax);

	// print results
	std::cout << "found " << result.size() << " entries:" << std::endl;
	for (std::vector<P*>::const_iterator it = result.begin(); it != result.end(); ++it) {
		std::cout << (*it)->d0 << " " << (*it)->d1 << " " << (*it)->d2 << std::endl;
	}

	return 1;
}